

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ffql_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  CPUMIPSState_conflict5 *pCVar1;
  float32 fVar2;
  uint c_00;
  int iVar3;
  int iVar4;
  float_status *pfVar5;
  float64 fVar6;
  bool local_81;
  bool local_71;
  int c_1;
  float_status *status_1;
  int c;
  float_status *status;
  uint32_t i;
  wr_t *pws;
  wr_t *pwd;
  wr_t *pwx;
  wr_t wx;
  uint32_t local_18;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState_conflict5 *env_local;
  
  wx.w[3] = ws;
  local_18 = wd;
  ws_local = df;
  _wd_local = env;
  if (df == 2) {
    for (status._4_4_ = 0; status._4_4_ < 4; status._4_4_ = status._4_4_ + 1) {
      pfVar5 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar5);
      fVar2 = float32_from_q16(*(int16_t *)
                                ((long)(env->active_fpu).fpr +
                                (ulong)status._4_4_ * 2 + (ulong)ws * 0x10 + 8),pfVar5);
      pCVar1 = _wd_local;
      ((wr_t *)&pwx)->w[status._4_4_] = fVar2;
      iVar3 = float32_is_zero(((wr_t *)&pwx)->w[status._4_4_]);
      local_71 = false;
      if (iVar3 == 0) {
        iVar3 = float32_is_zero_or_denormal(((wr_t *)&pwx)->w[status._4_4_]);
        local_71 = iVar3 != 0;
      }
      c_00 = update_msacsr(pCVar1,0,(uint)local_71);
      iVar3 = get_enabled_exceptions(_wd_local,c_00);
      if (iVar3 != 0) {
        fVar2 = float32_default_nan_mips64(pfVar5);
        ((wr_t *)&pwx)->w[status._4_4_] = (fVar2 ^ 0x400020) & 0xffffffc0 | c_00;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c5f,
                    "void helper_msa_ffql_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    for (status._4_4_ = 0; status._4_4_ < 2; status._4_4_ = status._4_4_ + 1) {
      pfVar5 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar5);
      fVar6 = float64_from_q32(*(int32_t *)
                                ((long)(env->active_fpu).fpr +
                                (ulong)status._4_4_ * 4 + (ulong)ws * 0x10 + 8),pfVar5);
      pCVar1 = _wd_local;
      ((wr_t *)&pwx)->d[status._4_4_] = fVar6;
      iVar3 = float64_is_zero(((wr_t *)&pwx)->d[status._4_4_]);
      local_81 = false;
      if (iVar3 == 0) {
        iVar3 = float64_is_zero_or_denormal(((wr_t *)&pwx)->d[status._4_4_]);
        local_81 = iVar3 != 0;
      }
      iVar3 = update_msacsr(pCVar1,0,(uint)local_81);
      iVar4 = get_enabled_exceptions(_wd_local,iVar3);
      if (iVar4 != 0) {
        fVar6 = float64_default_nan_mips64(pfVar5);
        ((wr_t *)&pwx)->d[status._4_4_] =
             (fVar6 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar3;
      }
    }
  }
  msa_move_v((wr_t *)((env->active_fpu).fpr + wd),(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_ffql_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Lh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}